

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int enum_dsk(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  char *__s1;
  finfo *pfVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  DIR *__dirp;
  dirent *pdVar6;
  char *pcVar7;
  FINFO *pFVar8;
  FPROP *pFVar9;
  size_t sVar10;
  byte *pbVar12;
  FINFO *pFVar13;
  char fver [16];
  char tver [16];
  stat sbuf;
  char pname [255];
  char pext [255];
  char text [255];
  char tname [255];
  char namebuf [4096];
  int local_150c;
  char local_14e8 [16];
  char local_14d8 [16];
  stat local_14c8;
  byte local_1438 [256];
  char local_1338 [256];
  char local_1238 [256];
  byte local_1138 [256];
  byte local_1038 [4104];
  ulong uVar11;
  
  piVar5 = __errno_location();
  *piVar5 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar5 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar6 = readdir(__dirp);
      alarm(0);
      pFVar13 = (FINFO *)0x0;
      local_150c = 0;
      goto LAB_00117628;
    }
  } while (*piVar5 == 4);
  alarm(0);
  goto LAB_001175d8;
LAB_00117628:
  if (pdVar6 == (dirent *)0x0) {
    if (*piVar5 != 4) {
      closedir(__dirp);
      if (local_150c < 1) {
        return local_150c;
      }
      *finfo_buf = pFVar13;
      return local_150c;
    }
  }
  else {
    __s1 = pdVar6->d_name;
    iVar3 = strcmp(__s1,".");
    if (((iVar3 != 0) && (iVar3 = strcmp(__s1,".."), iVar3 != 0)) && (pdVar6->d_ino != 0)) {
      strcpy((char *)local_1138,__s1);
      if (local_1138[0] != 0) {
        pbVar12 = local_1138;
        bVar2 = local_1138[0];
        do {
          pbVar12 = pbVar12 + 1;
          if ((byte)(bVar2 + 0xbf) < 0x1a) {
            pbVar12[-1] = bVar2 | 0x20;
          }
          bVar2 = *pbVar12;
        } while (bVar2 != 0);
      }
      strcpy((char *)local_1438,name);
      if (local_1438[0] != 0) {
        pbVar12 = local_1438;
        bVar2 = local_1438[0];
        do {
          pbVar12 = pbVar12 + 1;
          if ((byte)(bVar2 + 0xbf) < 0x1a) {
            pbVar12[-1] = bVar2 | 0x20;
          }
          bVar2 = *pbVar12;
        } while (bVar2 != 0);
      }
      separate_version((char *)local_1138,local_14d8,0);
      pcVar7 = strrchr((char *)local_1138,0x2e);
      if (pcVar7 == (char *)0x0) {
        local_1238[0] = '\0';
      }
      else {
        *pcVar7 = '\0';
        strcpy(local_1238,pcVar7 + 1);
      }
      pcVar7 = strrchr((char *)local_1438,0x2e);
      if (pcVar7 == (char *)0x0) {
        local_1338[0] = '\0';
      }
      else {
        *pcVar7 = '\0';
        strcpy(local_1338,pcVar7 + 1);
      }
      iVar3 = match_pattern((char *)local_1138,(char *)local_1438);
      if (((iVar3 != 0) && (iVar3 = match_pattern(local_1238,local_1338), iVar3 != 0)) &&
         (iVar3 = match_pattern(local_14d8,ver), iVar3 != 0)) {
        if (FreeFinfoList == (FINFO *)0x0) {
          pFVar8 = (FINFO *)calloc(1,0x228);
          if (pFVar8 != (FINFO *)0x0) {
            pFVar9 = (FPROP *)calloc(1,0x118);
            pFVar8->prop = pFVar9;
            if (pFVar9 != (FPROP *)0x0) goto LAB_0011782b;
            free(pFVar8);
          }
          pFVar8 = (FINFO *)0x0;
        }
        else {
          pFVar8 = FreeFinfoList;
          FreeFinfoList = FreeFinfoList->next;
        }
LAB_0011782b:
        pfVar1 = pFVar13;
        if (pFVar8 == (FINFO *)0x0) goto LAB_001179fc;
        pFVar8->next = pFVar13;
        sprintf((char *)local_1038,"%s/%s",dir,__s1);
        alarm(TIMEOUT_TIME);
        do {
          *piVar5 = 0;
          iVar3 = stat((char *)local_1038,&local_14c8);
          if (iVar3 != -1) {
            alarm(0);
            goto LAB_0011789d;
          }
        } while (*piVar5 == 4);
        alarm(0);
        pfVar1 = pFVar8;
        if (*piVar5 != 2) goto LAB_00117a25;
LAB_0011789d:
        strcpy((char *)local_1038,__s1);
        if ((local_14c8.st_mode & 0xf000) == 0x4000) {
          pFVar8->dirp = 1;
          quote_dname((char *)local_1038);
          strcpy(pFVar8->lname,(char *)local_1038);
          sVar10 = strlen((char *)local_1038);
          (pFVar8->lname + sVar10)[0] = '>';
          (pFVar8->lname + sVar10)[1] = '\0';
          sVar10 = sVar10 + 1;
        }
        else {
          pFVar8->dirp = 0;
          quote_fname((char *)local_1038);
          sVar10 = strlen((char *)local_1038);
          strcpy(pFVar8->lname,(char *)local_1038);
          pFVar8->lname[sVar10] = '\0';
        }
        pFVar8->lname_len = sVar10;
        strcpy((char *)local_1038,__s1);
        separate_version((char *)local_1038,local_14e8,1);
        if (local_1038[0] != 0) {
          pbVar12 = local_1038;
          bVar2 = local_1038[0];
          do {
            pbVar12 = pbVar12 + 1;
            if ((byte)(bVar2 + 0xbf) < 0x1a) {
              pbVar12[-1] = bVar2 | 0x20;
            }
            bVar2 = *pbVar12;
          } while (bVar2 != 0);
        }
        strcpy(pFVar8->no_ver_name,(char *)local_1038);
        if (local_14e8[0] == '\0') {
          uVar4 = 0;
        }
        else {
          uVar11 = strtoul(local_14e8,(char **)0x0,10);
          uVar4 = (uint)uVar11;
        }
        pFVar8->version = uVar4;
        pFVar8->ino = local_14c8.st_ino;
        local_150c = local_150c + 1;
        pFVar13 = pFVar8;
      }
    }
  }
  *piVar5 = 0;
  alarm(TIMEOUT_TIME);
  pdVar6 = readdir(__dirp);
  alarm(0);
  goto LAB_00117628;
LAB_001179fc:
  do {
    pFVar8 = pfVar1;
    pfVar1 = pFVar8->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar8->next = FreeFinfoList;
  FreeFinfoList = pFVar13;
  goto LAB_00117a49;
LAB_00117a25:
  do {
    pFVar13 = pfVar1;
    pfVar1 = pFVar13->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar13->next = FreeFinfoList;
  FreeFinfoList = pFVar8;
LAB_00117a49:
  closedir(__dirp);
LAB_001175d8:
  *Lisp_errno = *piVar5;
  return -1;
}

Assistant:

static int enum_dsk(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];
  char fver[VERSIONLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      separate_version(namebuf, fver, 1);
      DOWNCASE(namebuf);
      strcpy(nextp->no_ver_name, namebuf);
      if (*fver == '\0')
        nextp->version = 0;
      else
        nextp->version = strtoul(fver, (char **)NULL, 10);
      nextp->ino = sbuf.st_ino;
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}